

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O1

void EncodeContextMap(MemoryManager *m,EncodeContextMapArena *arena,uint32_t *context_map,
                     size_t context_map_size,size_t num_clusters,HuffmanTree *tree,
                     size_t *storage_ix,uint8_t *storage)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  void *p;
  size_t sVar23;
  long lVar24;
  char cVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  size_t sVar29;
  size_t __n;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  uint32_t uVar34;
  uint uVar35;
  int iVar46;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar47;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar68;
  undefined1 auVar66 [16];
  int iVar69;
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  int iVar87;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  char local_138 [264];
  long lVar49;
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters == 1) {
    return;
  }
  p = duckdb_brotli::BrotliAllocate(m,context_map_size * 4);
  uVar34 = *context_map;
  if (1 < context_map_size) {
    sVar23 = 1;
    do {
      if (uVar34 < context_map[sVar23]) {
        uVar34 = context_map[sVar23];
      }
      sVar23 = sVar23 + 1;
    } while (context_map_size != sVar23);
  }
  auVar36._4_4_ = 0;
  auVar36._0_4_ = uVar34;
  auVar36._8_4_ = uVar34;
  auVar36._12_4_ = 0;
  uVar26 = 0;
  auVar37 = auVar36;
  auVar48 = _DAT_0137a640;
  auVar50 = _DAT_0137a650;
  auVar51 = _DAT_0137a660;
  auVar52 = _DAT_0137a670;
  auVar53 = _DAT_0135a350;
  auVar54 = _DAT_0135a360;
  auVar55 = _DAT_0135a330;
  auVar56 = _DAT_0135a310;
  do {
    auVar66 = auVar36 ^ _DAT_01352200;
    auVar70 = auVar56 ^ _DAT_01352200;
    iVar46 = auVar66._0_4_;
    iVar83 = -(uint)(iVar46 < auVar70._0_4_);
    iVar47 = auVar66._4_4_;
    auVar72._4_4_ = -(uint)(iVar47 < auVar70._4_4_);
    iVar68 = auVar66._8_4_;
    iVar87 = -(uint)(iVar68 < auVar70._8_4_);
    iVar69 = auVar66._12_4_;
    auVar72._12_4_ = -(uint)(iVar69 < auVar70._12_4_);
    auVar66._4_4_ = iVar83;
    auVar66._0_4_ = iVar83;
    auVar66._8_4_ = iVar87;
    auVar66._12_4_ = iVar87;
    auVar66 = pshuflw(auVar37,auVar66,0xe8);
    auVar71._4_4_ = -(uint)(auVar70._4_4_ == iVar47);
    auVar71._12_4_ = -(uint)(auVar70._12_4_ == iVar69);
    auVar71._0_4_ = auVar71._4_4_;
    auVar71._8_4_ = auVar71._12_4_;
    auVar57 = pshuflw(in_XMM11,auVar71,0xe8);
    auVar72._0_4_ = auVar72._4_4_;
    auVar72._8_4_ = auVar72._12_4_;
    auVar70 = pshuflw(auVar66,auVar72,0xe8);
    auVar37._8_4_ = 0xffffffff;
    auVar37._0_8_ = 0xffffffffffffffff;
    auVar37._12_4_ = 0xffffffff;
    auVar37 = (auVar70 | auVar57 & auVar66) ^ auVar37;
    auVar37 = packssdw(auVar37,auVar37);
    cVar25 = (char)uVar26;
    if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_138[uVar26] = cVar25;
    }
    auVar57._4_4_ = iVar83;
    auVar57._0_4_ = iVar83;
    auVar57._8_4_ = iVar87;
    auVar57._12_4_ = iVar87;
    auVar72 = auVar71 & auVar57 | auVar72;
    auVar37 = packssdw(auVar72,auVar72);
    auVar70._8_4_ = 0xffffffff;
    auVar70._0_8_ = 0xffffffffffffffff;
    auVar70._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar70,auVar37 ^ auVar70);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._0_4_ >> 8 & 1) != 0) {
      local_138[uVar26 + 1] = cVar25 + '\x01';
    }
    auVar37 = auVar55 ^ _DAT_01352200;
    auVar58._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
    auVar58._4_4_ = -(uint)(iVar47 < auVar37._4_4_);
    auVar58._8_4_ = -(uint)(iVar68 < auVar37._8_4_);
    auVar58._12_4_ = -(uint)(iVar69 < auVar37._12_4_);
    auVar73._4_4_ = auVar58._0_4_;
    auVar73._0_4_ = auVar58._0_4_;
    auVar73._8_4_ = auVar58._8_4_;
    auVar73._12_4_ = auVar58._8_4_;
    iVar83 = -(uint)(auVar37._4_4_ == iVar47);
    iVar87 = -(uint)(auVar37._12_4_ == iVar69);
    auVar10._4_4_ = iVar83;
    auVar10._0_4_ = iVar83;
    auVar10._8_4_ = iVar87;
    auVar10._12_4_ = iVar87;
    auVar84._4_4_ = auVar58._4_4_;
    auVar84._0_4_ = auVar58._4_4_;
    auVar84._8_4_ = auVar58._12_4_;
    auVar84._12_4_ = auVar58._12_4_;
    auVar37 = auVar10 & auVar73 | auVar84;
    auVar37 = packssdw(auVar37,auVar37);
    auVar1._8_4_ = 0xffffffff;
    auVar1._0_8_ = 0xffffffffffffffff;
    auVar1._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar1,auVar37 ^ auVar1);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._0_4_ >> 0x10 & 1) != 0) {
      local_138[uVar26 + 2] = cVar25 + '\x02';
    }
    auVar37 = pshufhw(auVar37,auVar73,0x84);
    auVar11._4_4_ = iVar83;
    auVar11._0_4_ = iVar83;
    auVar11._8_4_ = iVar87;
    auVar11._12_4_ = iVar87;
    auVar70 = pshufhw(auVar58,auVar11,0x84);
    auVar66 = pshufhw(auVar37,auVar84,0x84);
    auVar38._8_4_ = 0xffffffff;
    auVar38._0_8_ = 0xffffffffffffffff;
    auVar38._12_4_ = 0xffffffff;
    auVar38 = (auVar66 | auVar70 & auVar37) ^ auVar38;
    auVar37 = packssdw(auVar38,auVar38);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._0_4_ >> 0x18 & 1) != 0) {
      local_138[uVar26 + 3] = cVar25 + '\x03';
    }
    auVar37 = auVar54 ^ _DAT_01352200;
    auVar59._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
    auVar59._4_4_ = -(uint)(iVar47 < auVar37._4_4_);
    auVar59._8_4_ = -(uint)(iVar68 < auVar37._8_4_);
    auVar59._12_4_ = -(uint)(iVar69 < auVar37._12_4_);
    auVar12._4_4_ = auVar59._0_4_;
    auVar12._0_4_ = auVar59._0_4_;
    auVar12._8_4_ = auVar59._8_4_;
    auVar12._12_4_ = auVar59._8_4_;
    auVar70 = pshuflw(auVar84,auVar12,0xe8);
    auVar39._0_4_ = -(uint)(auVar37._0_4_ == iVar46);
    auVar39._4_4_ = -(uint)(auVar37._4_4_ == iVar47);
    auVar39._8_4_ = -(uint)(auVar37._8_4_ == iVar68);
    auVar39._12_4_ = -(uint)(auVar37._12_4_ == iVar69);
    auVar74._4_4_ = auVar39._4_4_;
    auVar74._0_4_ = auVar39._4_4_;
    auVar74._8_4_ = auVar39._12_4_;
    auVar74._12_4_ = auVar39._12_4_;
    auVar37 = pshuflw(auVar39,auVar74,0xe8);
    auVar75._4_4_ = auVar59._4_4_;
    auVar75._0_4_ = auVar59._4_4_;
    auVar75._8_4_ = auVar59._12_4_;
    auVar75._12_4_ = auVar59._12_4_;
    auVar66 = pshuflw(auVar59,auVar75,0xe8);
    auVar2._8_4_ = 0xffffffff;
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 & auVar70,(auVar66 | auVar37 & auVar70) ^ auVar2);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_138[uVar26 + 4] = cVar25 + '\x04';
    }
    auVar13._4_4_ = auVar59._0_4_;
    auVar13._0_4_ = auVar59._0_4_;
    auVar13._8_4_ = auVar59._8_4_;
    auVar13._12_4_ = auVar59._8_4_;
    auVar75 = auVar74 & auVar13 | auVar75;
    auVar66 = packssdw(auVar75,auVar75);
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37,auVar66 ^ auVar3);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._4_2_ >> 8 & 1) != 0) {
      local_138[uVar26 + 5] = cVar25 + '\x05';
    }
    auVar37 = auVar53 ^ _DAT_01352200;
    auVar60._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
    auVar60._4_4_ = -(uint)(iVar47 < auVar37._4_4_);
    auVar60._8_4_ = -(uint)(iVar68 < auVar37._8_4_);
    auVar60._12_4_ = -(uint)(iVar69 < auVar37._12_4_);
    auVar76._4_4_ = auVar60._0_4_;
    auVar76._0_4_ = auVar60._0_4_;
    auVar76._8_4_ = auVar60._8_4_;
    auVar76._12_4_ = auVar60._8_4_;
    iVar83 = -(uint)(auVar37._4_4_ == iVar47);
    iVar87 = -(uint)(auVar37._12_4_ == iVar69);
    auVar14._4_4_ = iVar83;
    auVar14._0_4_ = iVar83;
    auVar14._8_4_ = iVar87;
    auVar14._12_4_ = iVar87;
    auVar85._4_4_ = auVar60._4_4_;
    auVar85._0_4_ = auVar60._4_4_;
    auVar85._8_4_ = auVar60._12_4_;
    auVar85._12_4_ = auVar60._12_4_;
    auVar37 = auVar14 & auVar76 | auVar85;
    auVar37 = packssdw(auVar37,auVar37);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar4,auVar37 ^ auVar4);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_138[uVar26 + 6] = cVar25 + '\x06';
    }
    auVar37 = pshufhw(auVar37,auVar76,0x84);
    auVar15._4_4_ = iVar83;
    auVar15._0_4_ = iVar83;
    auVar15._8_4_ = iVar87;
    auVar15._12_4_ = iVar87;
    auVar70 = pshufhw(auVar60,auVar15,0x84);
    auVar66 = pshufhw(auVar37,auVar85,0x84);
    auVar40._8_4_ = 0xffffffff;
    auVar40._0_8_ = 0xffffffffffffffff;
    auVar40._12_4_ = 0xffffffff;
    auVar40 = (auVar66 | auVar70 & auVar37) ^ auVar40;
    auVar37 = packssdw(auVar40,auVar40);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._6_2_ >> 8 & 1) != 0) {
      local_138[uVar26 + 7] = cVar25 + '\a';
    }
    auVar37 = auVar52 ^ _DAT_01352200;
    auVar61._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
    auVar61._4_4_ = -(uint)(iVar47 < auVar37._4_4_);
    auVar61._8_4_ = -(uint)(iVar68 < auVar37._8_4_);
    auVar61._12_4_ = -(uint)(iVar69 < auVar37._12_4_);
    auVar16._4_4_ = auVar61._0_4_;
    auVar16._0_4_ = auVar61._0_4_;
    auVar16._8_4_ = auVar61._8_4_;
    auVar16._12_4_ = auVar61._8_4_;
    auVar70 = pshuflw(auVar85,auVar16,0xe8);
    auVar41._0_4_ = -(uint)(auVar37._0_4_ == iVar46);
    auVar41._4_4_ = -(uint)(auVar37._4_4_ == iVar47);
    auVar41._8_4_ = -(uint)(auVar37._8_4_ == iVar68);
    auVar41._12_4_ = -(uint)(auVar37._12_4_ == iVar69);
    auVar77._4_4_ = auVar41._4_4_;
    auVar77._0_4_ = auVar41._4_4_;
    auVar77._8_4_ = auVar41._12_4_;
    auVar77._12_4_ = auVar41._12_4_;
    auVar37 = pshuflw(auVar41,auVar77,0xe8);
    auVar78._4_4_ = auVar61._4_4_;
    auVar78._0_4_ = auVar61._4_4_;
    auVar78._8_4_ = auVar61._12_4_;
    auVar78._12_4_ = auVar61._12_4_;
    auVar66 = pshuflw(auVar61,auVar78,0xe8);
    auVar62._8_4_ = 0xffffffff;
    auVar62._0_8_ = 0xffffffffffffffff;
    auVar62._12_4_ = 0xffffffff;
    auVar62 = (auVar66 | auVar37 & auVar70) ^ auVar62;
    auVar66 = packssdw(auVar62,auVar62);
    auVar37 = packsswb(auVar37 & auVar70,auVar66);
    if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_138[uVar26 + 8] = cVar25 + '\b';
    }
    auVar17._4_4_ = auVar61._0_4_;
    auVar17._0_4_ = auVar61._0_4_;
    auVar17._8_4_ = auVar61._8_4_;
    auVar17._12_4_ = auVar61._8_4_;
    auVar78 = auVar77 & auVar17 | auVar78;
    auVar66 = packssdw(auVar78,auVar78);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar66 = packssdw(auVar66 ^ auVar5,auVar66 ^ auVar5);
    auVar37 = packsswb(auVar37,auVar66);
    if ((auVar37._8_2_ >> 8 & 1) != 0) {
      local_138[uVar26 + 9] = cVar25 + '\t';
    }
    auVar37 = auVar51 ^ _DAT_01352200;
    auVar63._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
    auVar63._4_4_ = -(uint)(iVar47 < auVar37._4_4_);
    auVar63._8_4_ = -(uint)(iVar68 < auVar37._8_4_);
    auVar63._12_4_ = -(uint)(iVar69 < auVar37._12_4_);
    auVar79._4_4_ = auVar63._0_4_;
    auVar79._0_4_ = auVar63._0_4_;
    auVar79._8_4_ = auVar63._8_4_;
    auVar79._12_4_ = auVar63._8_4_;
    iVar83 = -(uint)(auVar37._4_4_ == iVar47);
    iVar87 = -(uint)(auVar37._12_4_ == iVar69);
    auVar18._4_4_ = iVar83;
    auVar18._0_4_ = iVar83;
    auVar18._8_4_ = iVar87;
    auVar18._12_4_ = iVar87;
    auVar86._4_4_ = auVar63._4_4_;
    auVar86._0_4_ = auVar63._4_4_;
    auVar86._8_4_ = auVar63._12_4_;
    auVar86._12_4_ = auVar63._12_4_;
    auVar37 = auVar18 & auVar79 | auVar86;
    auVar37 = packssdw(auVar37,auVar37);
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar6,auVar37 ^ auVar6);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      local_138[uVar26 + 10] = cVar25 + '\n';
    }
    auVar37 = pshufhw(auVar37,auVar79,0x84);
    auVar19._4_4_ = iVar83;
    auVar19._0_4_ = iVar83;
    auVar19._8_4_ = iVar87;
    auVar19._12_4_ = iVar87;
    auVar70 = pshufhw(auVar63,auVar19,0x84);
    auVar66 = pshufhw(auVar37,auVar86,0x84);
    auVar42._8_4_ = 0xffffffff;
    auVar42._0_8_ = 0xffffffffffffffff;
    auVar42._12_4_ = 0xffffffff;
    auVar42 = (auVar66 | auVar70 & auVar37) ^ auVar42;
    auVar37 = packssdw(auVar42,auVar42);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._10_2_ >> 8 & 1) != 0) {
      local_138[uVar26 + 0xb] = cVar25 + '\v';
    }
    auVar37 = auVar50 ^ _DAT_01352200;
    auVar64._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
    auVar64._4_4_ = -(uint)(iVar47 < auVar37._4_4_);
    auVar64._8_4_ = -(uint)(iVar68 < auVar37._8_4_);
    auVar64._12_4_ = -(uint)(iVar69 < auVar37._12_4_);
    auVar20._4_4_ = auVar64._0_4_;
    auVar20._0_4_ = auVar64._0_4_;
    auVar20._8_4_ = auVar64._8_4_;
    auVar20._12_4_ = auVar64._8_4_;
    auVar70 = pshuflw(auVar86,auVar20,0xe8);
    auVar43._0_4_ = -(uint)(auVar37._0_4_ == iVar46);
    auVar43._4_4_ = -(uint)(auVar37._4_4_ == iVar47);
    auVar43._8_4_ = -(uint)(auVar37._8_4_ == iVar68);
    auVar43._12_4_ = -(uint)(auVar37._12_4_ == iVar69);
    auVar80._4_4_ = auVar43._4_4_;
    auVar80._0_4_ = auVar43._4_4_;
    auVar80._8_4_ = auVar43._12_4_;
    auVar80._12_4_ = auVar43._12_4_;
    auVar37 = pshuflw(auVar43,auVar80,0xe8);
    auVar81._4_4_ = auVar64._4_4_;
    auVar81._0_4_ = auVar64._4_4_;
    auVar81._8_4_ = auVar64._12_4_;
    auVar81._12_4_ = auVar64._12_4_;
    auVar66 = pshuflw(auVar64,auVar81,0xe8);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 & auVar70,(auVar66 | auVar37 & auVar70) ^ auVar7);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_138[uVar26 + 0xc] = cVar25 + '\f';
    }
    auVar21._4_4_ = auVar64._0_4_;
    auVar21._0_4_ = auVar64._0_4_;
    auVar21._8_4_ = auVar64._8_4_;
    auVar21._12_4_ = auVar64._8_4_;
    auVar81 = auVar80 & auVar21 | auVar81;
    auVar66 = packssdw(auVar81,auVar81);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37,auVar66 ^ auVar8);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._12_2_ >> 8 & 1) != 0) {
      local_138[uVar26 + 0xd] = cVar25 + '\r';
    }
    auVar37 = auVar48 ^ _DAT_01352200;
    auVar65._0_4_ = -(uint)(iVar46 < auVar37._0_4_);
    auVar65._4_4_ = -(uint)(iVar47 < auVar37._4_4_);
    auVar65._8_4_ = -(uint)(iVar68 < auVar37._8_4_);
    auVar65._12_4_ = -(uint)(iVar69 < auVar37._12_4_);
    auVar82._4_4_ = auVar65._0_4_;
    auVar82._0_4_ = auVar65._0_4_;
    auVar82._8_4_ = auVar65._8_4_;
    auVar82._12_4_ = auVar65._8_4_;
    iVar46 = -(uint)(auVar37._4_4_ == iVar47);
    iVar47 = -(uint)(auVar37._12_4_ == iVar69);
    auVar67._4_4_ = iVar46;
    auVar67._0_4_ = iVar46;
    auVar67._8_4_ = iVar47;
    auVar67._12_4_ = iVar47;
    auVar44._4_4_ = auVar65._4_4_;
    auVar44._0_4_ = auVar65._4_4_;
    auVar44._8_4_ = auVar65._12_4_;
    auVar44._12_4_ = auVar65._12_4_;
    auVar44 = auVar67 & auVar82 | auVar44;
    auVar37 = packssdw(auVar44,auVar44);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar9,auVar37 ^ auVar9);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_138[uVar26 + 0xe] = cVar25 + '\x0e';
    }
    auVar37 = pshufhw(auVar37,auVar82,0x84);
    in_XMM11 = pshufhw(auVar65,auVar67,0x84);
    in_XMM11 = in_XMM11 & auVar37;
    auVar22._4_4_ = auVar65._4_4_;
    auVar22._0_4_ = auVar65._4_4_;
    auVar22._8_4_ = auVar65._12_4_;
    auVar22._12_4_ = auVar65._12_4_;
    auVar37 = pshufhw(auVar37,auVar22,0x84);
    auVar45._8_4_ = 0xffffffff;
    auVar45._0_8_ = 0xffffffffffffffff;
    auVar45._12_4_ = 0xffffffff;
    auVar45 = (auVar37 | in_XMM11) ^ auVar45;
    auVar37 = packssdw(auVar45,auVar45);
    auVar37 = packsswb(auVar37,auVar37);
    if ((auVar37._14_2_ >> 8 & 1) != 0) {
      local_138[uVar26 + 0xf] = cVar25 + '\x0f';
    }
    uVar26 = uVar26 + 0x10;
    lVar30 = (long)DAT_0137a680;
    lVar49 = auVar56._8_8_;
    auVar56._0_8_ = auVar56._0_8_ + lVar30;
    lVar24 = DAT_0137a680._8_8_;
    auVar56._8_8_ = lVar49 + lVar24;
    lVar49 = auVar55._8_8_;
    auVar55._0_8_ = auVar55._0_8_ + lVar30;
    auVar55._8_8_ = lVar49 + lVar24;
    lVar49 = auVar54._8_8_;
    auVar54._0_8_ = auVar54._0_8_ + lVar30;
    auVar54._8_8_ = lVar49 + lVar24;
    lVar49 = auVar53._8_8_;
    auVar53._0_8_ = auVar53._0_8_ + lVar30;
    auVar53._8_8_ = lVar49 + lVar24;
    lVar49 = auVar52._8_8_;
    auVar52._0_8_ = auVar52._0_8_ + lVar30;
    auVar52._8_8_ = lVar49 + lVar24;
    lVar49 = auVar51._8_8_;
    auVar51._0_8_ = auVar51._0_8_ + lVar30;
    auVar51._8_8_ = lVar49 + lVar24;
    lVar49 = auVar50._8_8_;
    auVar50._0_8_ = auVar50._0_8_ + lVar30;
    auVar50._8_8_ = lVar49 + lVar24;
    lVar49 = auVar48._8_8_;
    auVar48._0_8_ = auVar48._0_8_ + lVar30;
    auVar48._8_8_ = lVar49 + lVar24;
    auVar37 = _DAT_0137a680;
  } while (((ulong)uVar34 + 0x10 & 0xfffffffffffffff0) != uVar26);
  if (context_map_size == 0) {
    uVar35 = 0;
  }
  else {
    uVar35 = uVar34 + 1;
    sVar23 = 0;
    do {
      if (uVar35 == 0) {
        __n = 0;
      }
      else {
        sVar29 = 0;
        do {
          __n = sVar29;
          if (local_138[sVar29] == (char)context_map[sVar23]) break;
          sVar29 = sVar29 + 1;
          __n = (ulong)uVar35;
        } while (uVar35 != sVar29);
      }
      *(int *)((long)p + sVar23 * 4) = (int)__n;
      cVar25 = local_138[__n];
      if (__n != 0) {
        memmove(local_138 + 1,local_138,__n);
      }
      local_138[0] = cVar25;
      sVar23 = sVar23 + 1;
    } while (sVar23 != context_map_size);
    uVar35 = 0;
    uVar26 = 0;
    do {
      uVar32 = uVar26 + 1;
      if (uVar26 + 1 < context_map_size) {
        uVar32 = context_map_size;
      }
      do {
        uVar27 = uVar26;
        if (*(int *)((long)p + uVar26 * 4) == 0) break;
        uVar26 = uVar26 + 1;
        uVar27 = uVar32;
      } while (uVar32 != uVar26);
      uVar26 = uVar27;
      uVar31 = 0;
      if (uVar27 < context_map_size) {
        iVar46 = (int)uVar27;
        uVar28 = 0;
        do {
          uVar26 = uVar27;
          uVar31 = uVar28;
          if (*(int *)((long)p + uVar27 * 4) != 0) break;
          uVar28 = uVar28 + 1;
          uVar27 = uVar27 + 1;
          uVar26 = context_map_size;
          uVar31 = (int)context_map_size - iVar46;
        } while (context_map_size != uVar27);
      }
      if (uVar35 < uVar31) {
        uVar35 = uVar31;
      }
    } while (uVar26 < context_map_size);
  }
  uVar31 = 0x1f;
  if (uVar35 != 0) {
    for (; uVar35 >> uVar31 == 0; uVar31 = uVar31 - 1) {
    }
  }
  uVar28 = 6;
  if (uVar31 < 6) {
    uVar28 = uVar31;
  }
  if (uVar35 == 0) {
    uVar28 = 0;
  }
  if (context_map_size == 0) {
    lVar30 = 0;
  }
  else {
    uVar35 = 2 << ((byte)uVar28 & 0x1f);
    lVar30 = 0;
    uVar26 = 0;
    do {
      iVar46 = *(int *)((long)p + uVar26 * 4);
      if (iVar46 == 0) {
        uVar32 = 1;
        if (uVar26 + 1 < context_map_size) {
          uVar32 = (ulong)(uint)((int)context_map_size - (int)uVar26);
          uVar27 = 1;
          do {
            if (*(int *)((long)p + uVar27 * 4 + uVar26 * 4) != 0) {
              uVar32 = uVar27 & 0xffffffff;
              break;
            }
            uVar27 = uVar27 + 1;
          } while (context_map_size - uVar26 != uVar27);
        }
        uVar27 = uVar32;
        if ((int)uVar32 != 0) {
LAB_01140512:
          uVar31 = (uint)uVar27;
          if (uVar35 <= uVar31) goto code_r0x01140516;
          uVar33 = 0x1f;
          if (uVar31 != 0) {
            for (; uVar31 >> uVar33 == 0; uVar33 = uVar33 - 1) {
            }
          }
          uVar33 = ((-1 << ((byte)uVar33 & 0x1f)) + uVar31) * 0x200 | uVar33;
          goto LAB_011404bf;
        }
      }
      else {
        uVar33 = iVar46 + uVar28;
        uVar32 = 1;
LAB_011404bf:
        *(uint *)((long)p + lVar30 * 4) = uVar33;
        lVar30 = lVar30 + 1;
      }
LAB_011404c6:
      uVar26 = uVar26 + uVar32;
    } while (uVar26 < context_map_size);
  }
  switchD_005700f1::default(arena,0,0x440);
  if (lVar30 != 0) {
    lVar24 = 0;
    do {
      arena->histogram[*(uint *)((long)p + lVar24 * 4) & 0x1ff] =
           arena->histogram[*(uint *)((long)p + lVar24 * 4) & 0x1ff] + 1;
      lVar24 = lVar24 + 1;
    } while (lVar30 != lVar24);
  }
  uVar32 = *storage_ix;
  uVar26 = uVar32 + 1;
  *(ulong *)(storage + (uVar32 >> 3)) =
       (ulong)(uVar28 != 0) << ((byte)uVar32 & 7) | (ulong)storage[uVar32 >> 3];
  *storage_ix = uVar26;
  if (uVar28 != 0) {
    *(ulong *)(storage + (uVar26 >> 3)) =
         (ulong)(uVar28 - 1) << ((byte)uVar26 & 7) | (ulong)storage[uVar26 >> 3];
    *storage_ix = uVar32 + 5;
  }
  BuildAndStoreHuffmanTree
            (arena->histogram,uVar28 + num_clusters,uVar28 + num_clusters,tree,arena->depths,
             arena->bits,storage_ix,storage);
  if (lVar30 != 0) {
    lVar24 = 0;
    do {
      uVar35 = *(uint *)((long)p + lVar24 * 4);
      uVar31 = uVar35 & 0x1ff;
      uVar32 = (ulong)uVar31;
      uVar26 = *storage_ix;
      uVar27 = arena->depths[uVar32] + uVar26;
      *(ulong *)(storage + (uVar26 >> 3)) =
           (ulong)arena->bits[uVar32] << ((byte)uVar26 & 7) | (ulong)storage[uVar26 >> 3];
      *storage_ix = uVar27;
      if (uVar31 - 1 < uVar28) {
        *(ulong *)(storage + (uVar27 >> 3)) =
             (ulong)(uVar35 >> 9) << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
        *storage_ix = uVar32 + uVar27;
      }
      lVar24 = lVar24 + 1;
    } while (lVar30 != lVar24);
  }
  uVar26 = *storage_ix;
  *(ulong *)(storage + (uVar26 >> 3)) = (ulong)storage[uVar26 >> 3] | 1L << ((byte)uVar26 & 7);
  *storage_ix = uVar26 + 1;
  duckdb_brotli::BrotliFree(m,p);
  return;
code_r0x01140516:
  *(uint *)((long)p + lVar30 * 4) = ~(-1 << ((byte)uVar28 & 0x1f)) << 9 | uVar28;
  lVar30 = lVar30 + 1;
  uVar31 = (uVar31 - uVar35) + 1;
  uVar27 = (ulong)uVar31;
  if (uVar31 == 0) goto LAB_011404c6;
  goto LAB_01140512;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             EncodeContextMapArena* arena,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t* BROTLI_RESTRICT const histogram = arena->histogram;
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t* BROTLI_RESTRICT const depths = arena->depths;
  uint16_t* BROTLI_RESTRICT const bits = arena->bits;

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(rle_symbols)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(arena->histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}